

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O2

int eval_expression(coda_cursor *cursor)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  size_t sVar6;
  ushort **ppuVar7;
  ulong uVar8;
  char *pcVar9;
  char *__format;
  long length;
  int value;
  
  iVar3 = 0;
  switch(expr_type) {
  case coda_expression_boolean:
    iVar3 = coda_expression_eval_bool(eval_expr,cursor,&value);
    if (iVar3 == 0) {
      pcVar9 = "true";
      if (value == 0) {
        pcVar9 = "false";
      }
LAB_00101bab:
      puts(pcVar9);
      return 0;
    }
    puVar4 = (undefined4 *)coda_get_errno();
    uVar5 = coda_errno_to_string(*puVar4);
    pcVar9 = "cannot evaluate boolean expression (%s)";
    break;
  case coda_expression_integer:
    iVar3 = coda_expression_eval_integer(eval_expr,cursor,&length);
    if (iVar3 == 0) {
      pcVar9 = (char *)&value;
      coda_str64(CONCAT44(length._4_4_,(uint)length),pcVar9);
      goto LAB_00101bab;
    }
    puVar4 = (undefined4 *)coda_get_errno();
    uVar5 = coda_errno_to_string(*puVar4);
    pcVar9 = "cannot evaluate integer expression (%s)";
    break;
  case coda_expression_float:
    iVar3 = coda_expression_eval_float(eval_expr,cursor,&value);
    if (iVar3 == 0) {
      printf("%.16g\n",_value);
      return 0;
    }
    puVar4 = (undefined4 *)coda_get_errno();
    uVar5 = coda_errno_to_string(*puVar4);
    pcVar9 = "cannot evaluate floating point expression (%s)";
    break;
  case coda_expression_string:
    _value = (char *)0x0;
    iVar3 = coda_expression_eval_string(eval_expr,cursor,&value,&length);
    pcVar9 = _value;
    if (iVar3 == 0) {
      if (_value != (char *)0x0 && (uint)length != 0) {
        if ((int)(uint)length < 0) {
          sVar6 = strlen(_value);
          length._0_4_ = (uint)sVar6;
        }
        uVar2 = (uint)length;
        if ((int)(uint)length < 1) {
          uVar2 = 0;
        }
        for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
          bVar1 = pcVar9[uVar8];
          switch(bVar1) {
          case 7:
            __format = "\\a";
            break;
          case 8:
            __format = "\\b";
            break;
          case 9:
            __format = "\\t";
            break;
          case 10:
            __format = "\\n";
            break;
          case 0xb:
            __format = "\\v";
            break;
          case 0xc:
            __format = "\\f";
            break;
          case 0xd:
            __format = "\\r";
            break;
          default:
            if (bVar1 == 0x5c) {
              __format = "\\\\";
              break;
            }
            if (bVar1 == 0x22) {
              __format = "\\\"";
              break;
            }
            if (bVar1 == 0x1b) {
              __format = "\\e";
              break;
            }
            ppuVar7 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar7 + (long)(char)bVar1 * 2 + 1) & 0x40) == 0) {
              printf("\\%03o",(ulong)bVar1);
            }
            else {
              putchar((int)(char)bVar1);
            }
            goto LAB_00101c9d;
          }
          printf(__format);
LAB_00101c9d:
        }
      }
      putchar(10);
      free(_value);
      return 0;
    }
    puVar4 = (undefined4 *)coda_get_errno();
    uVar5 = coda_errno_to_string(*puVar4);
    pcVar9 = "cannot evaluate string expression (%s)";
    break;
  case coda_expression_node:
  case coda_expression_void:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codaeval/codaeval.c"
                  ,0xe6,"int eval_expression(coda_cursor *)");
  default:
    goto switchD_00101a65_default;
  }
  coda_set_error(0xfffffe6f,pcVar9,uVar5);
  iVar3 = -1;
switchD_00101a65_default:
  return iVar3;
}

Assistant:

static int eval_expression(coda_cursor *cursor)
{
    switch (expr_type)
    {
        case coda_expression_boolean:  /* boolean */
            {
                int value;

                if (coda_expression_eval_bool(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate boolean expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%s\n", (value ? "true" : "false"));
            }
            break;
        case coda_expression_integer:  /* integer */
            {
                int64_t value;
                char s[21];

                if (coda_expression_eval_integer(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate integer expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                coda_str64(value, s);
                printf("%s\n", s);
            }
            break;
        case coda_expression_float:    /* floating point */
            {
                double value;

                if (coda_expression_eval_float(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate floating point expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%.16g\n", value);
            }
            break;
        case coda_expression_string:   /* string */
            {
                char *value = NULL;
                long length;

                if (coda_expression_eval_string(eval_expr, cursor, &value, &length))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate string expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                generate_escaped_string(value, length);
                printf("\n");
                if (value != NULL)
                {
                    free(value);
                }
            }
            break;
        case coda_expression_void:
        case coda_expression_node:
            assert(0);
            exit(1);
    }

    return 0;
}